

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprk.c
# Opt level: O0

ARKodeSPRKTable arkodeSymplecticSofroniou10(void)

{
  ARKodeSPRKTable sprk_table;
  int in_stack_ffffffffffffffec;
  ARKodeSPRKTable local_8;
  
  local_8 = ARKodeSPRKTable_Alloc(in_stack_ffffffffffffffec);
  if (local_8 == (ARKodeSPRKTable)0x0) {
    local_8 = (ARKodeSPRKTable)0x0;
  }
  else {
    local_8->q = 10;
    local_8->stages = 0x24;
    *local_8->a = 0.07879572252168641;
    local_8->a[1] = 0.3130961034151085;
    local_8->a[2] = 0.027918383235078066;
    local_8->a[3] = -0.22959284159390708;
    local_8->a[4] = 0.13096206107716488;
    local_8->a[5] = -0.2697334056545107;
    local_8->a[6] = 0.07497334315589144;
    local_8->a[7] = 0.1119934239998102;
    local_8->a[8] = 0.36613344954622673;
    local_8->a[9] = -0.3991056301360359;
    local_8->a[10] = 0.10308739852747108;
    local_8->a[0xb] = 0.41143087395589023;
    local_8->a[0xc] = -0.0048663605831352616;
    local_8->a[0xd] = -0.3920333537086399;
    local_8->a[0xe] = 0.05194250296244965;
    local_8->a[0xf] = 0.050665090759924494;
    local_8->a[0x10] = 0.049674370639729876;
    local_8->a[0x11] = 0.049317735759594535;
    local_8->a[0x12] = local_8->a[0x10];
    local_8->a[0x13] = local_8->a[0xf];
    local_8->a[0x14] = local_8->a[0xe];
    local_8->a[0x15] = local_8->a[0xd];
    local_8->a[0x16] = local_8->a[0xc];
    local_8->a[0x17] = local_8->a[0xb];
    local_8->a[0x18] = local_8->a[10];
    local_8->a[0x19] = local_8->a[9];
    local_8->a[0x1a] = local_8->a[8];
    local_8->a[0x1b] = local_8->a[7];
    local_8->a[0x1c] = local_8->a[6];
    local_8->a[0x1d] = local_8->a[5];
    local_8->a[0x1e] = local_8->a[4];
    local_8->a[0x1f] = local_8->a[3];
    local_8->a[0x20] = local_8->a[2];
    local_8->a[0x21] = local_8->a[1];
    local_8->a[0x22] = *local_8->a;
    local_8->a[0x23] = 0.0;
    *local_8->ahat = *local_8->a / 2.0;
    local_8->ahat[1] = (*local_8->a + local_8->a[1]) / 2.0;
    local_8->ahat[2] = (local_8->a[1] + local_8->a[2]) / 2.0;
    local_8->ahat[3] = (local_8->a[2] + local_8->a[3]) / 2.0;
    local_8->ahat[4] = (local_8->a[3] + local_8->a[4]) / 2.0;
    local_8->ahat[5] = (local_8->a[4] + local_8->a[5]) / 2.0;
    local_8->ahat[6] = (local_8->a[5] + local_8->a[6]) / 2.0;
    local_8->ahat[7] = (local_8->a[6] + local_8->a[7]) / 2.0;
    local_8->ahat[8] = (local_8->a[7] + local_8->a[8]) / 2.0;
    local_8->ahat[9] = (local_8->a[8] + local_8->a[9]) / 2.0;
    local_8->ahat[10] = (local_8->a[9] + local_8->a[10]) / 2.0;
    local_8->ahat[0xb] = (local_8->a[10] + local_8->a[0xb]) / 2.0;
    local_8->ahat[0xc] = (local_8->a[0xb] + local_8->a[0xc]) / 2.0;
    local_8->ahat[0xd] = (local_8->a[0xc] + local_8->a[0xd]) / 2.0;
    local_8->ahat[0xe] = (local_8->a[0xd] + local_8->a[0xe]) / 2.0;
    local_8->ahat[0xf] = (local_8->a[0xe] + local_8->a[0xf]) / 2.0;
    local_8->ahat[0x10] = (local_8->a[0xf] + local_8->a[0x10]) / 2.0;
    local_8->ahat[0x11] = (local_8->a[0x10] + local_8->a[0x11]) / 2.0;
    local_8->ahat[0x12] = local_8->ahat[0x11];
    local_8->ahat[0x13] = local_8->ahat[0x10];
    local_8->ahat[0x14] = local_8->ahat[0xf];
    local_8->ahat[0x15] = local_8->ahat[0xe];
    local_8->ahat[0x16] = local_8->ahat[0xd];
    local_8->ahat[0x17] = local_8->ahat[0xc];
    local_8->ahat[0x18] = local_8->ahat[0xb];
    local_8->ahat[0x19] = local_8->ahat[10];
    local_8->ahat[0x1a] = local_8->ahat[9];
    local_8->ahat[0x1b] = local_8->ahat[8];
    local_8->ahat[0x1c] = local_8->ahat[7];
    local_8->ahat[0x1d] = local_8->ahat[6];
    local_8->ahat[0x1e] = local_8->ahat[5];
    local_8->ahat[0x1f] = local_8->ahat[4];
    local_8->ahat[0x20] = local_8->ahat[3];
    local_8->ahat[0x21] = local_8->ahat[2];
    local_8->ahat[0x22] = local_8->ahat[1];
    local_8->ahat[0x23] = *local_8->ahat;
  }
  return local_8;
}

Assistant:

static ARKodeSPRKTable arkodeSymplecticSofroniou10(void)
{
  ARKodeSPRKTable sprk_table = ARKodeSPRKTable_Alloc(36);
  if (!sprk_table) { return NULL; }
  sprk_table->q      = 10;
  sprk_table->stages = 36;

  sprk_table->a[0]    = SUN_RCONST(0.078795722521686419263907679337684);
  sprk_table->a[1]    = SUN_RCONST(0.31309610341510852776481247192647);
  sprk_table->a[2]    = SUN_RCONST(0.027918383235078066109520273275299);
  sprk_table->a[3]    = -SUN_RCONST(0.22959284159390709415121339679655);
  sprk_table->a[4]    = SUN_RCONST(0.13096206107716486317465685927961);
  sprk_table->a[5]    = -SUN_RCONST(0.26973340565451071434460973222411);
  sprk_table->a[6]    = SUN_RCONST(0.074973343155891435666137105641410);
  sprk_table->a[7]    = SUN_RCONST(0.11199342399981020488957508073640);
  sprk_table->a[8]    = SUN_RCONST(0.36613344954622675119314812353150);
  sprk_table->a[9]    = -SUN_RCONST(0.39910563013603589787862981058340);
  sprk_table->a[10]   = SUN_RCONST(0.10308739852747107731580277001372);
  sprk_table->a[11]   = SUN_RCONST(0.41143087395589023782070411897608);
  sprk_table->a[12]   = -SUN_RCONST(0.0048663605831352617621956593099771);
  sprk_table->a[13]   = -SUN_RCONST(0.39203335370863990644808193642610);
  sprk_table->a[14]   = SUN_RCONST(0.051942502962449647037182904015976);
  sprk_table->a[15]   = SUN_RCONST(0.050665090759924496335874344156866);
  sprk_table->a[16]   = SUN_RCONST(0.049674370639729879054568800279461);
  sprk_table->a[17]   = SUN_RCONST(0.049317735759594537917680008339338);
  sprk_table->a[18]   = sprk_table->a[16];
  sprk_table->a[19]   = sprk_table->a[15];
  sprk_table->a[20]   = sprk_table->a[14];
  sprk_table->a[21]   = sprk_table->a[13];
  sprk_table->a[22]   = sprk_table->a[12];
  sprk_table->a[23]   = sprk_table->a[11];
  sprk_table->a[24]   = sprk_table->a[10];
  sprk_table->a[25]   = sprk_table->a[9];
  sprk_table->a[26]   = sprk_table->a[8];
  sprk_table->a[27]   = sprk_table->a[7];
  sprk_table->a[28]   = sprk_table->a[6];
  sprk_table->a[29]   = sprk_table->a[5];
  sprk_table->a[30]   = sprk_table->a[4];
  sprk_table->a[31]   = sprk_table->a[3];
  sprk_table->a[32]   = sprk_table->a[2];
  sprk_table->a[33]   = sprk_table->a[1];
  sprk_table->a[34]   = sprk_table->a[0];
  sprk_table->a[35]   = SUN_RCONST(0.0);
  sprk_table->ahat[0] = sprk_table->a[0] / SUN_RCONST(2.0);
  sprk_table->ahat[1] = (sprk_table->a[0] + sprk_table->a[1]) / SUN_RCONST(2.0);
  sprk_table->ahat[2] = (sprk_table->a[1] + sprk_table->a[2]) / SUN_RCONST(2.0);
  sprk_table->ahat[3] = (sprk_table->a[2] + sprk_table->a[3]) / SUN_RCONST(2.0);
  sprk_table->ahat[4] = (sprk_table->a[3] + sprk_table->a[4]) / SUN_RCONST(2.0);
  sprk_table->ahat[5] = (sprk_table->a[4] + sprk_table->a[5]) / SUN_RCONST(2.0);
  sprk_table->ahat[6] = (sprk_table->a[5] + sprk_table->a[6]) / SUN_RCONST(2.0);
  sprk_table->ahat[7] = (sprk_table->a[6] + sprk_table->a[7]) / SUN_RCONST(2.0);
  sprk_table->ahat[8] = (sprk_table->a[7] + sprk_table->a[8]) / SUN_RCONST(2.0);
  sprk_table->ahat[9] = (sprk_table->a[8] + sprk_table->a[9]) / SUN_RCONST(2.0);
  sprk_table->ahat[10] = (sprk_table->a[9] + sprk_table->a[10]) / SUN_RCONST(2.0);
  sprk_table->ahat[11] = (sprk_table->a[10] + sprk_table->a[11]) /
                         SUN_RCONST(2.0);
  sprk_table->ahat[12] = (sprk_table->a[11] + sprk_table->a[12]) /
                         SUN_RCONST(2.0);
  sprk_table->ahat[13] = (sprk_table->a[12] + sprk_table->a[13]) /
                         SUN_RCONST(2.0);
  sprk_table->ahat[14] = (sprk_table->a[13] + sprk_table->a[14]) /
                         SUN_RCONST(2.0);
  sprk_table->ahat[15] = (sprk_table->a[14] + sprk_table->a[15]) /
                         SUN_RCONST(2.0);
  sprk_table->ahat[16] = (sprk_table->a[15] + sprk_table->a[16]) /
                         SUN_RCONST(2.0);
  sprk_table->ahat[17] = (sprk_table->a[16] + sprk_table->a[17]) /
                         SUN_RCONST(2.0);
  sprk_table->ahat[18] = sprk_table->ahat[17];
  sprk_table->ahat[19] = sprk_table->ahat[16];
  sprk_table->ahat[20] = sprk_table->ahat[15];
  sprk_table->ahat[21] = sprk_table->ahat[14];
  sprk_table->ahat[22] = sprk_table->ahat[13];
  sprk_table->ahat[23] = sprk_table->ahat[12];
  sprk_table->ahat[24] = sprk_table->ahat[11];
  sprk_table->ahat[25] = sprk_table->ahat[10];
  sprk_table->ahat[26] = sprk_table->ahat[9];
  sprk_table->ahat[27] = sprk_table->ahat[8];
  sprk_table->ahat[28] = sprk_table->ahat[7];
  sprk_table->ahat[29] = sprk_table->ahat[6];
  sprk_table->ahat[30] = sprk_table->ahat[5];
  sprk_table->ahat[31] = sprk_table->ahat[4];
  sprk_table->ahat[32] = sprk_table->ahat[3];
  sprk_table->ahat[33] = sprk_table->ahat[2];
  sprk_table->ahat[34] = sprk_table->ahat[1];
  sprk_table->ahat[35] = sprk_table->ahat[0];

  return sprk_table;
}